

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

void Ivy_ObjUpdateLevelR_rec(Ivy_Man_t *p,Ivy_Obj_t *pObj,int ReqNew)

{
  int Entry;
  uint uVar1;
  int iVar2;
  Ivy_Obj_t *pObj_00;
  
  while( true ) {
    if (pObj->Id == 0) {
      return;
    }
    uVar1 = *(uint *)&pObj->field_0x8 & 0xf;
    if (2 < uVar1 - 5) break;
    pObj_00 = (Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    iVar2 = Vec_IntEntry(p->vRequired,pObj_00->Id);
    Entry = ReqNew + -1;
    if (ReqNew <= iVar2) {
      Vec_IntWriteEntry(p->vRequired,pObj_00->Id,Entry);
      Ivy_ObjUpdateLevelR_rec(p,pObj_00,Entry);
    }
    if ((*(uint *)&pObj->field_0x8 & 0xf) == 7) {
      return;
    }
    pObj = (Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    iVar2 = Vec_IntEntry(p->vRequired,pObj->Id);
    if (iVar2 < ReqNew) {
      return;
    }
    Vec_IntWriteEntry(p->vRequired,pObj->Id,Entry);
    ReqNew = Entry;
  }
  if (uVar1 == 1) {
    return;
  }
  if (uVar1 == 4) {
    return;
  }
  __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                ,0x1c1,"void Ivy_ObjUpdateLevelR_rec(Ivy_Man_t *, Ivy_Obj_t *, int)");
}

Assistant:

void Ivy_ObjUpdateLevelR_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj, int ReqNew )
{
    Ivy_Obj_t * pFanin;
    if ( Ivy_ObjIsConst1(pObj) || Ivy_ObjIsCi(pObj) )
        return;
    assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj) );
    // process the first fanin
    pFanin = Ivy_ObjFanin0(pObj);
    if ( Vec_IntEntry(p->vRequired, pFanin->Id) > ReqNew - 1 )
    {
        Vec_IntWriteEntry( p->vRequired, pFanin->Id, ReqNew - 1 );
        Ivy_ObjUpdateLevelR_rec( p, pFanin, ReqNew - 1 );
    }
    if ( Ivy_ObjIsBuf(pObj) )
        return;
    // process the second fanin
    pFanin = Ivy_ObjFanin1(pObj);
    if ( Vec_IntEntry(p->vRequired, pFanin->Id) > ReqNew - 1 )
    {
        Vec_IntWriteEntry( p->vRequired, pFanin->Id, ReqNew - 1 );
        Ivy_ObjUpdateLevelR_rec( p, pFanin, ReqNew - 1 );
    }
}